

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

void __thiscall vk::BinaryRegistryDetail::BinaryIndexHash::BinaryIndexHash(BinaryIndexHash *this)

{
  deMemPool *pool;
  BinaryIndexHashImpl *pBVar1;
  undefined8 *puVar2;
  
  pool = deMemPool_createRoot((deMemPoolUtil *)0x0,0);
  (this->m_memPool).m_pool = pool;
  if (pool == (deMemPool *)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = time;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  pBVar1 = (BinaryIndexHashImpl *)deMemPool_alloc(pool,0x20);
  if (pBVar1 != (BinaryIndexHashImpl *)0x0) {
    pBVar1->numElements = 0;
    pBVar1->slotTableSize = 0;
    pBVar1->slotTable = (BinaryIndexHashImplSlot **)0x0;
    pBVar1->slotFreeList = (BinaryIndexHashImplSlot *)0x0;
    pBVar1->pool = pool;
    this->m_hash = pBVar1;
    return;
  }
  this->m_hash = (BinaryIndexHashImpl *)0x0;
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = time;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}